

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void TTD::NSTokens::InitKeyNamesArray(char16 ***names,size_t **lengths)

{
  Memory *pMVar1;
  char16_t **alloc;
  unsigned_long *alloc_00;
  size_t sVar2;
  TrackAllocData local_88;
  char16 *local_60;
  size_t *lengthArray;
  undefined8 local_50;
  TrackAllocData local_48;
  char16_t **local_20;
  char16 **nameArray;
  size_t **lengths_local;
  char16 ***names_local;
  
  nameArray = (char16 **)lengths;
  lengths_local = (size_t **)names;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&char16_t_const*::typeinfo,0,0x78,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSerialize.cpp"
             ,0xf);
  pMVar1 = (Memory *)
           Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
  lengthArray = (size_t *)Memory::HeapAllocator::NoThrowAlloc;
  local_50 = 0;
  alloc = Memory::AllocateArray<Memory::HeapAllocator,char16_t_const*,true>
                    (pMVar1,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,0x78);
  local_20 = TTD_MEM_ALLOC_CHECK<char16_t_const*>(alloc);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_88,(type_info *)&unsigned_long::typeinfo,0,0x78,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTSerialize.cpp"
             ,0x10);
  pMVar1 = (Memory *)
           Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_88);
  alloc_00 = Memory::AllocateArray<Memory::HeapAllocator,unsigned_long,true>
                       (pMVar1,(HeapAllocator *)Memory::HeapAllocator::NoThrowAlloc,0,0x78);
  local_60 = (char16 *)TTD_MEM_ALLOC_CHECK<unsigned_long>(alloc_00);
  local_20[1] = L"count";
  sVar2 = PAL_wcslen(L"count");
  *(size_t *)(local_60 + 4) = sVar2;
  local_20[2] = L"values";
  sVar2 = PAL_wcslen(L"values");
  *(size_t *)(local_60 + 8) = sVar2;
  local_20[3] = L"entry";
  sVar2 = PAL_wcslen(L"entry");
  *(size_t *)(local_60 + 0xc) = sVar2;
  local_20[4] = L"index";
  sVar2 = PAL_wcslen(L"index");
  *(size_t *)(local_60 + 0x10) = sVar2;
  local_20[5] = L"offset";
  sVar2 = PAL_wcslen(L"offset");
  *(size_t *)(local_60 + 0x14) = sVar2;
  local_20[6] = L"resultValue";
  sVar2 = PAL_wcslen(L"resultValue");
  *(size_t *)(local_60 + 0x18) = sVar2;
  local_20[7] = L"reaction";
  sVar2 = PAL_wcslen(L"reaction");
  *(size_t *)(local_60 + 0x1c) = sVar2;
  local_20[8] = L"pid";
  sVar2 = PAL_wcslen(L"pid");
  *(size_t *)(local_60 + 0x20) = sVar2;
  local_20[9] = L"nullVal";
  sVar2 = PAL_wcslen(L"nullVal");
  *(size_t *)(local_60 + 0x24) = sVar2;
  local_20[10] = L"boolVal";
  sVar2 = PAL_wcslen(L"boolVal");
  *(size_t *)(local_60 + 0x28) = sVar2;
  local_20[0xb] = L"i32Val";
  sVar2 = PAL_wcslen(L"i32Val");
  *(size_t *)(local_60 + 0x2c) = sVar2;
  local_20[0xc] = L"u32Val";
  sVar2 = PAL_wcslen(L"u32Val");
  *(size_t *)(local_60 + 0x30) = sVar2;
  local_20[0xd] = L"i64Val";
  sVar2 = PAL_wcslen(L"i64Val");
  *(size_t *)(local_60 + 0x34) = sVar2;
  local_20[0xe] = L"u64Val";
  sVar2 = PAL_wcslen(L"u64Val");
  *(size_t *)(local_60 + 0x38) = sVar2;
  local_20[0xf] = L"doubleVal";
  sVar2 = PAL_wcslen(L"doubleVal");
  *(size_t *)(local_60 + 0x3c) = sVar2;
  local_20[0x10] = L"ptrIdVal";
  sVar2 = PAL_wcslen(L"ptrIdVal");
  *(size_t *)(local_60 + 0x40) = sVar2;
  local_20[0x11] = L"stringVal";
  sVar2 = PAL_wcslen(L"stringVal");
  *(size_t *)(local_60 + 0x44) = sVar2;
  local_20[0x12] = L"argRetVal";
  sVar2 = PAL_wcslen(L"argRetVal");
  *(size_t *)(local_60 + 0x48) = sVar2;
  local_20[0x13] = L"newTargetVal";
  sVar2 = PAL_wcslen(L"newTargetVal");
  *(size_t *)(local_60 + 0x4c) = sVar2;
  local_20[0x14] = L"ttdVarTag";
  sVar2 = PAL_wcslen(L"ttdVarTag");
  *(size_t *)(local_60 + 0x50) = sVar2;
  local_20[0x15] = L"getterEntry";
  sVar2 = PAL_wcslen(L"getterEntry");
  *(size_t *)(local_60 + 0x54) = sVar2;
  local_20[0x16] = L"setterEntry";
  sVar2 = PAL_wcslen(L"setterEntry");
  *(size_t *)(local_60 + 0x58) = sVar2;
  local_20[0x17] = L"tagVal";
  sVar2 = PAL_wcslen(L"tagVal");
  *(size_t *)(local_60 + 0x5c) = sVar2;
  local_20[0x18] = L"originInfo";
  sVar2 = PAL_wcslen(L"originInfo");
  *(size_t *)(local_60 + 0x60) = sVar2;
  local_20[0x19] = L"isWellKnownToken";
  sVar2 = PAL_wcslen(L"isWellKnownToken");
  *(size_t *)(local_60 + 100) = sVar2;
  local_20[0x1a] = L"wellKnownToken";
  sVar2 = PAL_wcslen(L"wellKnownToken");
  *(size_t *)(local_60 + 0x68) = sVar2;
  local_20[0x1b] = L"isCrossSite";
  sVar2 = PAL_wcslen(L"isCrossSite");
  *(size_t *)(local_60 + 0x6c) = sVar2;
  local_20[0x1c] = L"dataKindTag";
  sVar2 = PAL_wcslen(L"dataKindTag");
  *(size_t *)(local_60 + 0x70) = sVar2;
  local_20[0x1d] = L"attributeTag";
  sVar2 = PAL_wcslen(L"attributeTag");
  *(size_t *)(local_60 + 0x74) = sVar2;
  local_20[0x1e] = L"propertyId";
  sVar2 = PAL_wcslen(L"propertyId");
  *(size_t *)(local_60 + 0x78) = sVar2;
  local_20[0x1f] = L"handlerType";
  sVar2 = PAL_wcslen(L"handlerType");
  *(size_t *)(local_60 + 0x7c) = sVar2;
  local_20[0x20] = L"jsTypeId";
  sVar2 = PAL_wcslen(L"jsTypeId");
  *(size_t *)(local_60 + 0x80) = sVar2;
  local_20[0x21] = L"scopeType";
  sVar2 = PAL_wcslen(L"scopeType");
  *(size_t *)(local_60 + 0x84) = sVar2;
  local_20[0x22] = L"objectType";
  sVar2 = PAL_wcslen(L"objectType");
  *(size_t *)(local_60 + 0x88) = sVar2;
  local_20[0x23] = L"argRetValueType";
  sVar2 = PAL_wcslen(L"argRetValueType");
  *(size_t *)(local_60 + 0x8c) = sVar2;
  local_20[0x24] = L"ctxTag";
  sVar2 = PAL_wcslen(L"ctxTag");
  *(size_t *)(local_60 + 0x90) = sVar2;
  local_20[0x25] = L"ctxUri";
  sVar2 = PAL_wcslen(L"ctxUri");
  *(size_t *)(local_60 + 0x94) = sVar2;
  local_20[0x26] = L"logTag";
  sVar2 = PAL_wcslen(L"logTag");
  *(size_t *)(local_60 + 0x98) = sVar2;
  local_20[0x27] = L"handlerId";
  sVar2 = PAL_wcslen(L"handlerId");
  *(size_t *)(local_60 + 0x9c) = sVar2;
  local_20[0x28] = L"typeId";
  sVar2 = PAL_wcslen(L"typeId");
  *(size_t *)(local_60 + 0xa0) = sVar2;
  local_20[0x29] = L"prototypeVar";
  sVar2 = PAL_wcslen(L"prototypeVar");
  *(size_t *)(local_60 + 0xa4) = sVar2;
  local_20[0x2a] = L"functionBodyId";
  sVar2 = PAL_wcslen(L"functionBodyId");
  *(size_t *)(local_60 + 0xa8) = sVar2;
  local_20[0x2b] = L"debuggerScopeId";
  sVar2 = PAL_wcslen(L"debuggerScopeId");
  *(size_t *)(local_60 + 0xac) = sVar2;
  local_20[0x2c] = L"parentBodyId";
  sVar2 = PAL_wcslen(L"parentBodyId");
  *(size_t *)(local_60 + 0xb0) = sVar2;
  local_20[0x2d] = L"bodyCounterId";
  sVar2 = PAL_wcslen(L"bodyCounterId");
  *(size_t *)(local_60 + 0xb4) = sVar2;
  local_20[0x2e] = L"cachedScopeObjId";
  sVar2 = PAL_wcslen(L"cachedScopeObjId");
  *(size_t *)(local_60 + 0xb8) = sVar2;
  local_20[0x2f] = L"scopeId";
  sVar2 = PAL_wcslen(L"scopeId");
  *(size_t *)(local_60 + 0xbc) = sVar2;
  local_20[0x30] = L"subscopeId";
  sVar2 = PAL_wcslen(L"subscopeId");
  *(size_t *)(local_60 + 0xc0) = sVar2;
  local_20[0x31] = L"slotId";
  sVar2 = PAL_wcslen(L"slotId");
  *(size_t *)(local_60 + 0xc4) = sVar2;
  local_20[0x32] = L"primitiveId";
  sVar2 = PAL_wcslen(L"primitiveId");
  *(size_t *)(local_60 + 200) = sVar2;
  local_20[0x33] = L"objectId";
  sVar2 = PAL_wcslen(L"objectId");
  *(size_t *)(local_60 + 0xcc) = sVar2;
  local_20[0x34] = L"attributeFlags";
  sVar2 = PAL_wcslen(L"attributeFlags");
  *(size_t *)(local_60 + 0xd0) = sVar2;
  local_20[0x35] = L"extensibleFlag";
  sVar2 = PAL_wcslen(L"extensibleFlag");
  *(size_t *)(local_60 + 0xd4) = sVar2;
  local_20[0x36] = L"fcallFlags";
  sVar2 = PAL_wcslen(L"fcallFlags");
  *(size_t *)(local_60 + 0xd8) = sVar2;
  local_20[0x37] = L"name";
  sVar2 = PAL_wcslen(L"name");
  *(size_t *)(local_60 + 0xdc) = sVar2;
  local_20[0x38] = L"nameInfo";
  sVar2 = PAL_wcslen(L"nameInfo");
  *(size_t *)(local_60 + 0xe0) = sVar2;
  local_20[0x39] = L"srcLocation";
  sVar2 = PAL_wcslen(L"srcLocation");
  *(size_t *)(local_60 + 0xe4) = sVar2;
  local_20[0x3a] = L"src";
  sVar2 = PAL_wcslen(L"src");
  *(size_t *)(local_60 + 0xe8) = sVar2;
  local_20[0x3b] = L"column";
  sVar2 = PAL_wcslen(L"column");
  *(size_t *)(local_60 + 0xec) = sVar2;
  local_20[0x3c] = L"line";
  sVar2 = PAL_wcslen(L"line");
  *(size_t *)(local_60 + 0xf0) = sVar2;
  local_20[0x3d] = L"functionColumn";
  sVar2 = PAL_wcslen(L"functionColumn");
  *(size_t *)(local_60 + 0xf4) = sVar2;
  local_20[0x3e] = L"functionLine";
  sVar2 = PAL_wcslen(L"functionLine");
  *(size_t *)(local_60 + 0xf8) = sVar2;
  local_20[0x3f] = L"uri";
  sVar2 = PAL_wcslen(L"uri");
  *(size_t *)(local_60 + 0xfc) = sVar2;
  local_20[0x40] = L"moduleId";
  sVar2 = PAL_wcslen(L"moduleId");
  *(size_t *)(local_60 + 0x100) = sVar2;
  local_20[0x41] = L"sourceContextId";
  sVar2 = PAL_wcslen(L"sourceContextId");
  *(size_t *)(local_60 + 0x104) = sVar2;
  local_20[0x42] = L"isGlobalCode";
  sVar2 = PAL_wcslen(L"isGlobalCode");
  *(size_t *)(local_60 + 0x108) = sVar2;
  local_20[0x43] = L"scopeChain";
  sVar2 = PAL_wcslen(L"scopeChain");
  *(size_t *)(local_60 + 0x10c) = sVar2;
  local_20[0x44] = L"boundFunction";
  sVar2 = PAL_wcslen(L"boundFunction");
  *(size_t *)(local_60 + 0x110) = sVar2;
  local_20[0x45] = L"boundThis";
  sVar2 = PAL_wcslen(L"boundThis");
  *(size_t *)(local_60 + 0x114) = sVar2;
  local_20[0x46] = L"boundArgs";
  sVar2 = PAL_wcslen(L"boundArgs");
  *(size_t *)(local_60 + 0x118) = sVar2;
  local_20[0x47] = L"numberOfArgs";
  sVar2 = PAL_wcslen(L"numberOfArgs");
  *(size_t *)(local_60 + 0x11c) = sVar2;
  local_20[0x48] = L"deletedArgs";
  sVar2 = PAL_wcslen(L"deletedArgs");
  *(size_t *)(local_60 + 0x120) = sVar2;
  local_20[0x49] = L"boxedInfo";
  sVar2 = PAL_wcslen(L"boxedInfo");
  *(size_t *)(local_60 + 0x124) = sVar2;
  local_20[0x4a] = L"inlineSlotCapacity";
  sVar2 = PAL_wcslen(L"inlineSlotCapacity");
  *(size_t *)(local_60 + 0x128) = sVar2;
  local_20[0x4b] = L"totalSlotCapacity";
  sVar2 = PAL_wcslen(L"totalSlotCapacity");
  *(size_t *)(local_60 + 300) = sVar2;
  local_20[0x4c] = L"isFunctionMetaData";
  sVar2 = PAL_wcslen(L"isFunctionMetaData");
  *(size_t *)(local_60 + 0x130) = sVar2;
  local_20[0x4d] = L"isDepOn";
  sVar2 = PAL_wcslen(L"isDepOn");
  *(size_t *)(local_60 + 0x134) = sVar2;
  local_20[0x4e] = L"isExpression";
  sVar2 = PAL_wcslen(L"isExpression");
  *(size_t *)(local_60 + 0x138) = sVar2;
  local_20[0x4f] = L"loadFlag";
  sVar2 = PAL_wcslen(L"loadFlag");
  *(size_t *)(local_60 + 0x13c) = sVar2;
  local_20[0x50] = L"isEval";
  sVar2 = PAL_wcslen(L"isEval");
  *(size_t *)(local_60 + 0x140) = sVar2;
  local_20[0x51] = L"isDynamic";
  sVar2 = PAL_wcslen(L"isDynamic");
  *(size_t *)(local_60 + 0x144) = sVar2;
  local_20[0x52] = L"isRuntime";
  sVar2 = PAL_wcslen(L"isRuntime");
  *(size_t *)(local_60 + 0x148) = sVar2;
  local_20[0x53] = L"isBound";
  sVar2 = PAL_wcslen(L"isBound");
  *(size_t *)(local_60 + 0x14c) = sVar2;
  local_20[0x54] = L"isNumeric";
  sVar2 = PAL_wcslen(L"isNumeric");
  *(size_t *)(local_60 + 0x150) = sVar2;
  local_20[0x55] = L"isSymbol";
  sVar2 = PAL_wcslen(L"isSymbol");
  *(size_t *)(local_60 + 0x154) = sVar2;
  local_20[0x56] = L"isValid";
  sVar2 = PAL_wcslen(L"isValid");
  *(size_t *)(local_60 + 0x158) = sVar2;
  local_20[0x57] = L"arch";
  sVar2 = PAL_wcslen(L"arch");
  *(size_t *)(local_60 + 0x15c) = sVar2;
  local_20[0x58] = L"platform";
  sVar2 = PAL_wcslen(L"platform");
  *(size_t *)(local_60 + 0x160) = sVar2;
  local_20[0x59] = L"diagEnabled";
  sVar2 = PAL_wcslen(L"diagEnabled");
  *(size_t *)(local_60 + 0x164) = sVar2;
  local_20[0x5a] = L"timeTotal";
  sVar2 = PAL_wcslen(L"timeTotal");
  *(size_t *)(local_60 + 0x168) = sVar2;
  local_20[0x5b] = L"timeGC";
  sVar2 = PAL_wcslen(L"timeGC");
  *(size_t *)(local_60 + 0x16c) = sVar2;
  local_20[0x5c] = L"timeMark";
  sVar2 = PAL_wcslen(L"timeMark");
  *(size_t *)(local_60 + 0x170) = sVar2;
  local_20[0x5d] = L"timeExtract";
  sVar2 = PAL_wcslen(L"timeExtract");
  *(size_t *)(local_60 + 0x174) = sVar2;
  local_20[0x5e] = L"timeWrite";
  sVar2 = PAL_wcslen(L"timeWrite");
  *(size_t *)(local_60 + 0x178) = sVar2;
  local_20[0x5f] = L"usedMemory";
  sVar2 = PAL_wcslen(L"usedMemory");
  *(size_t *)(local_60 + 0x17c) = sVar2;
  local_20[0x60] = L"reservedMemory";
  sVar2 = PAL_wcslen(L"reservedMemory");
  *(size_t *)(local_60 + 0x180) = sVar2;
  local_20[0x61] = L"eventKind";
  sVar2 = PAL_wcslen(L"eventKind");
  *(size_t *)(local_60 + 0x184) = sVar2;
  local_20[0x62] = L"eventResultStatus";
  sVar2 = PAL_wcslen(L"eventResultStatus");
  *(size_t *)(local_60 + 0x188) = sVar2;
  local_20[99] = L"eventTime";
  sVar2 = PAL_wcslen(L"eventTime");
  *(size_t *)(local_60 + 0x18c) = sVar2;
  local_20[100] = L"functionTime";
  sVar2 = PAL_wcslen(L"functionTime");
  *(size_t *)(local_60 + 400) = sVar2;
  local_20[0x65] = L"loopTime";
  sVar2 = PAL_wcslen(L"loopTime");
  *(size_t *)(local_60 + 0x194) = sVar2;
  local_20[0x66] = L"jsrtEventKind";
  sVar2 = PAL_wcslen(L"jsrtEventKind");
  *(size_t *)(local_60 + 0x198) = sVar2;
  local_20[0x67] = L"matchingCallBegin";
  sVar2 = PAL_wcslen(L"matchingCallBegin");
  *(size_t *)(local_60 + 0x19c) = sVar2;
  local_20[0x68] = L"rootNestingDepth";
  sVar2 = PAL_wcslen(L"rootNestingDepth");
  *(size_t *)(local_60 + 0x1a0) = sVar2;
  local_20[0x69] = L"hostCallbackId";
  sVar2 = PAL_wcslen(L"hostCallbackId");
  *(size_t *)(local_60 + 0x1a4) = sVar2;
  local_20[0x6a] = L"newCallbackId";
  sVar2 = PAL_wcslen(L"newCallbackId");
  *(size_t *)(local_60 + 0x1a8) = sVar2;
  local_20[0x6b] = L"beginTime";
  sVar2 = PAL_wcslen(L"beginTime");
  *(size_t *)(local_60 + 0x1ac) = sVar2;
  local_20[0x6c] = L"endTime";
  sVar2 = PAL_wcslen(L"endTime");
  *(size_t *)(local_60 + 0x1b0) = sVar2;
  local_20[0x6d] = L"snapshotDir";
  sVar2 = PAL_wcslen(L"snapshotDir");
  *(size_t *)(local_60 + 0x1b4) = sVar2;
  local_20[0x6e] = L"restoreTime";
  sVar2 = PAL_wcslen(L"restoreTime");
  *(size_t *)(local_60 + 0x1b8) = sVar2;
  local_20[0x6f] = L"restoreLogTag";
  sVar2 = PAL_wcslen(L"restoreLogTag");
  *(size_t *)(local_60 + 0x1bc) = sVar2;
  local_20[0x70] = L"restoreIdentityTag";
  sVar2 = PAL_wcslen(L"restoreIdentityTag");
  *(size_t *)(local_60 + 0x1c0) = sVar2;
  local_20[0x71] = L"logDir";
  sVar2 = PAL_wcslen(L"logDir");
  *(size_t *)(local_60 + 0x1c4) = sVar2;
  local_20[0x72] = L"frame_slotArray";
  sVar2 = PAL_wcslen(L"frame_slotArray");
  *(size_t *)(local_60 + 0x1c8) = sVar2;
  local_20[0x73] = L"arguments_values";
  sVar2 = PAL_wcslen(L"arguments_values");
  *(size_t *)(local_60 + 0x1cc) = sVar2;
  local_20[0x74] = L"target";
  sVar2 = PAL_wcslen(L"target");
  *(size_t *)(local_60 + 0x1d0) = sVar2;
  local_20[0x75] = L"reject";
  sVar2 = PAL_wcslen(L"reject");
  *(size_t *)(local_60 + 0x1d4) = sVar2;
  local_20[0x76] = L"resolve";
  sVar2 = PAL_wcslen(L"resolve");
  *(size_t *)(local_60 + 0x1d8) = sVar2;
  local_20[0x77] = L"argument";
  sVar2 = PAL_wcslen(L"argument");
  *(size_t *)(local_60 + 0x1dc) = sVar2;
  *lengths_local = (size_t *)local_20;
  *nameArray = local_60;
  return;
}

Assistant:

void InitKeyNamesArray(const char16*** names, size_t** lengths)
        {
            const char16** nameArray = TT_HEAP_ALLOC_ARRAY(const char16*, (uint32)Key::Count);
            size_t* lengthArray = TT_HEAP_ALLOC_ARRAY(size_t, (uint32)Key::Count);

#define ENTRY_SERIALIZE_ENUM(K) { nameArray[(uint32)Key::##K] = _u(#K); lengthArray[(uint32)Key::##K] = wcslen(_u(#K)); }
#include "TTSerializeEnum.h"

            *names = nameArray;
            *lengths = lengthArray;
        }